

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O0

ostream * lf::io::operator<<(ostream *stream,Format *f)

{
  LfException *this;
  allocator<char> local_39;
  string local_38;
  Format *local_18;
  Format *f_local;
  ostream *stream_local;
  
  local_18 = f;
  f_local = (Format *)stream;
  if (*f == ASCII) {
    std::operator<<(stream,"ASCII");
  }
  else {
    if (*f != BINARY) {
      this = (LfException *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Unknown VtkFileFormat.",&local_39);
      lf::base::LfException::LfException(this,&local_38);
      __cxa_throw(this,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
    }
    std::operator<<(stream,"BINARY");
  }
  return (ostream *)f_local;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const VtkFile::Format& f) {
  switch (f) {
    case VtkFile::Format::ASCII:
      stream << "ASCII";
      break;
    case VtkFile::Format::BINARY:
      stream << "BINARY";
      break;
    default:
      throw base::LfException("Unknown VtkFileFormat.");
  }
  return stream;
}